

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O1

void __thiscall
FBitmap::CopyPixelDataRGB
          (FBitmap *this,int originx,int originy,BYTE *patch,int srcwidth,int srcheight,int step_x,
          int step_y,int rotate,int ct,FCopyInfo *inf,int r,int g,int b)

{
  BYTE BVar1;
  BYTE BVar2;
  int iVar3;
  FCopyInfo *pFVar4;
  int iVar5;
  bool bVar6;
  long lVar7;
  long lVar8;
  BYTE *pBVar9;
  int srcheight_local;
  int srcwidth_local;
  int originy_local;
  int originx_local;
  FBitmap *local_60;
  ulong local_58;
  long local_50;
  CopyFunc_conflict local_48;
  BYTE *local_40;
  BYTE *patch_local;
  
  srcheight_local = srcheight;
  srcwidth_local = srcwidth;
  originy_local = originy;
  originx_local = originx;
  patch_local = patch;
  bVar6 = ClipCopyPixelRect(&this->ClipRect,&originx_local,&originy_local,&patch_local,
                            &srcwidth_local,&srcheight_local,&step_x,&step_y,rotate);
  iVar5 = srcwidth_local;
  pFVar4 = inf;
  iVar3 = step_x;
  if (bVar6) {
    if (inf == (FCopyInfo *)0x0) {
      lVar7 = 0;
    }
    else {
      lVar7 = (long)(int)inf->op;
    }
    lVar8 = (long)srcheight_local;
    if (0 < lVar8) {
      local_40 = this->data + (long)originy_local * (long)this->Pitch + (long)originx_local * 4;
      local_48 = copyfuncs[lVar7][ct];
      local_50 = (long)step_y;
      lVar7 = 0;
      local_58 = (ulong)(b & 0xff);
      BVar2 = (BYTE)g;
      BVar1 = (BYTE)r;
      pBVar9 = patch_local;
      local_60 = this;
      do {
        (*local_48)(local_40 + local_60->Pitch * lVar7,pBVar9,iVar5,iVar3,pFVar4,BVar1,BVar2,
                    (BYTE)local_58);
        lVar7 = lVar7 + 1;
        pBVar9 = pBVar9 + local_50;
      } while (lVar8 != lVar7);
    }
  }
  return;
}

Assistant:

void FBitmap::CopyPixelDataRGB(int originx, int originy, const BYTE *patch, int srcwidth, 
							   int srcheight, int step_x, int step_y, int rotate, int ct, FCopyInfo *inf,
							   int r, int g, int b)
{
	if (ClipCopyPixelRect(&ClipRect, originx, originy, patch, srcwidth, srcheight, step_x, step_y, rotate))
	{
		BYTE *buffer = data + 4 * originx + Pitch * originy;
		int op = inf==NULL? OP_COPY : inf->op;
		for (int y=0;y<srcheight;y++)
		{
			copyfuncs[op][ct](&buffer[y*Pitch], &patch[y*step_y], srcwidth, step_x, inf, r, g, b);
		}
	}
}